

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.h
# Opt level: O0

void __thiscall
cppcms::widgets::numeric<double>::render_value(numeric<double> *this,form_context *context)

{
  ulong uVar1;
  ostream *poVar2;
  long in_RDI;
  string local_30 [48];
  
  uVar1 = cppcms::widgets::base_widget::set();
  if ((uVar1 & 1) == 0) {
    poVar2 = (ostream *)cppcms::form_context::out();
    poVar2 = std::operator<<(poVar2,"value=\"");
    cppcms::util::escape(local_30);
    poVar2 = std::operator<<(poVar2,local_30);
    std::operator<<(poVar2,"\" ");
    std::__cxx11::string::~string(local_30);
  }
  else {
    poVar2 = (ostream *)cppcms::form_context::out();
    poVar2 = std::operator<<(poVar2,"value=\"");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(double *)(in_RDI + 0x40));
    std::operator<<(poVar2,"\" ");
  }
  return;
}

Assistant:

virtual void render_value(form_context &context)
			{
				if(set())
					context.out()<<"value=\""<<value_<<"\" ";
				else
					context.out()<<"value=\""<<util::escape(loaded_string_)<<"\" ";
			}